

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O1

void Image_Function::ConvertToGrayScale
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height)

{
  uint uVar1;
  uint uVar2;
  uchar *puVar3;
  uchar *puVar4;
  long lVar5;
  uchar *puVar6;
  uchar *puVar7;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,out,startXOut,startYOut,width,height);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(out);
  if (in->_colorCount == '\x01') {
    Copy(in,startXIn,startYIn,out,startXOut,startYOut,width,height);
    return;
  }
  uVar1 = out->_rowSize;
  if (height * uVar1 != 0) {
    puVar3 = out->_data + (ulong)startXOut + (ulong)(startYOut * uVar1);
    puVar7 = puVar3 + height * uVar1;
    uVar2 = in->_rowSize;
    puVar4 = in->_data + (ulong)(startXIn * 3) + (ulong)(startYIn * uVar2);
    do {
      if (width != 0) {
        lVar5 = 0;
        puVar6 = puVar3;
        do {
          *puVar6 = (uchar)(((uint)puVar4[lVar5 + 2] + (uint)puVar4[lVar5 + 1] + (uint)puVar4[lVar5]
                            ) / 3);
          puVar6 = puVar6 + 1;
          lVar5 = lVar5 + 3;
        } while ((ulong)width * 3 != lVar5);
      }
      puVar3 = puVar3 + uVar1;
      puVar4 = puVar4 + uVar2;
    } while (puVar3 != puVar7);
  }
  return;
}

Assistant:

void ConvertToGrayScale( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                             uint32_t width, uint32_t height )
    {
        ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        VerifyGrayScaleImage( out );

        if( in.colorCount() == GRAY_SCALE ) {
            Copy( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
            return;
        }

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t colorCount = RGB;

        const uint8_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn * colorCount;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        for( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
            const uint8_t * inX = inY;
            uint8_t       * outX = outY;

            const uint8_t * outXEnd = outX + width;

            for( ; outX != outXEnd; ++outX, inX += colorCount )
                (*outX) = static_cast <uint8_t>((*(inX) + *(inX + 1) + *(inX + 2)) / 3u); // average of red, green and blue components
        }
    }